

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O3

int Io_ReadPlaMergeDistance1(word **pCs,int nCubes,int nWords,Vec_Bit_t *vMarks)

{
  ulong *puVar1;
  word *pwVar2;
  word *pwVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  int *piVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  size_t __size;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int local_60;
  
  iVar16 = nCubes >> 5;
  if (vMarks->nCap < nCubes) {
    iVar11 = (iVar16 + 1) - (uint)((nCubes & 0x1fU) == 0);
    __size = (long)iVar11 << 2;
    if (vMarks->pArray == (int *)0x0) {
      piVar7 = (int *)malloc(__size);
    }
    else {
      piVar7 = (int *)realloc(vMarks->pArray,__size);
    }
    vMarks->pArray = piVar7;
    if (piVar7 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                    ,0x163,"void Vec_BitGrow(Vec_Bit_t *, int)");
    }
    vMarks->nCap = iVar11 * 0x20;
  }
  uVar6 = (uint)((nCubes & 0x1fU) != 0);
  iVar11 = iVar16 + uVar6;
  if (iVar11 != 0 && SCARRY4(iVar16,uVar6) == iVar11 < 0) {
    memset(vMarks->pArray,0,(ulong)(iVar11 - 1) * 4 + 4);
  }
  vMarks->nSize = iVar11 * 0x20;
  if (nCubes < 1) {
    local_60 = 0;
  }
  else {
    uVar13 = (ulong)(uint)nWords;
    uVar12 = (ulong)(uint)nCubes;
    uVar14 = 1;
    local_60 = 0;
    uVar9 = 0;
    do {
      if ((long)vMarks->nSize <= (long)uVar9) {
LAB_002d41f5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      piVar7 = vMarks->pArray;
      uVar15 = uVar9 + 1;
      if (uVar15 < uVar12 && ((uint)piVar7[uVar9 >> 5 & 0x7ffffff] >> ((uint)uVar9 & 0x1f) & 1) == 0
         ) {
        uVar8 = uVar14;
LAB_002d40ef:
        if (uVar8 != (uint)vMarks->nSize) {
          uVar17 = uVar8 >> 5 & 0x7ffffff;
          uVar6 = piVar7[uVar17];
          if (((uVar6 >> ((uint)uVar8 & 0x1f) & 1) != 0) || (nWords < 1)) goto LAB_002d418c;
          pwVar2 = pCs[uVar9];
          pwVar3 = pCs[uVar8];
          bVar5 = true;
          uVar19 = 0;
          do {
            while( true ) {
              uVar18 = uVar19 + 1;
              uVar4 = pwVar2[uVar19];
              uVar10 = pwVar3[uVar19];
              uVar19 = uVar18;
              if (uVar4 == uVar10) break;
              if ((!bVar5) ||
                 (uVar10 = uVar10 ^ uVar4, uVar10 = (uVar10 >> 1 | uVar10) & 0x5555555555555555,
                 uVar4 = uVar10 - 1, (uVar10 ^ uVar4) <= uVar4)) goto LAB_002d418c;
              bVar5 = false;
              if (uVar18 == uVar13) goto LAB_002d419a;
            }
          } while (uVar18 != uVar13);
          if (bVar5) goto LAB_002d418c;
LAB_002d419a:
          uVar9 = 0;
          do {
            puVar1 = pwVar2 + uVar9;
            *puVar1 = *puVar1 & pwVar3[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar13 != uVar9);
          piVar7[uVar17] = uVar6 | 1 << ((byte)uVar8 & 0x1f);
          local_60 = local_60 + 1;
          goto LAB_002d41cc;
        }
        goto LAB_002d41f5;
      }
LAB_002d41cc:
      uVar14 = uVar14 + 1;
      uVar9 = uVar15;
    } while (uVar15 != uVar12);
  }
  return local_60;
LAB_002d418c:
  uVar8 = uVar8 + 1;
  if (uVar8 == uVar12) goto LAB_002d41cc;
  goto LAB_002d40ef;
}

Assistant:

int Io_ReadPlaMergeDistance1( word ** pCs, int nCubes, int nWords, Vec_Bit_t * vMarks )
{
    int c1, c2, Res, Counter = 0;
    Vec_BitFill( vMarks, nCubes, 0 );
    for ( c1 = 0; c1 < nCubes; c1++ )
        if ( !Vec_BitEntry(vMarks, c1) )
            for ( c2 = c1 + 1; c2 < nCubes; c2++ )
                if ( !Vec_BitEntry(vMarks, c2) )
                {
                    Res = Io_ReadPlaDistance1( pCs[c1], pCs[c2], nWords );
                    if ( !Res )
                        continue;
                    Abc_TtAnd( pCs[c1], pCs[c1], pCs[c2], nWords, 0 );
                    Vec_BitWriteEntry( vMarks, c2, 1 );
                    Counter++;
                    break;
                }
    return Counter;
}